

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultStack.cpp
# Opt level: O1

void __thiscall DefaultStack::DefaultStack(DefaultStack *this)

{
  ProtocolARP *arp;
  ProtocolIPv4 *ipv4;
  ProtocolUDP *udp;
  
  arp = &this->ARP;
  ipv4 = &this->IP;
  ProtocolMACEthernet::ProtocolMACEthernet(&this->MAC,arp,ipv4);
  udp = &this->UDP;
  ProtocolIPv4::ProtocolIPv4(ipv4,(InterfaceMAC *)this,arp,&this->ICMP,&this->TCP,udp);
  ProtocolARP::ProtocolARP(arp,(InterfaceMAC *)this,ipv4);
  ProtocolDHCP::ProtocolDHCP(&this->DHCP,(InterfaceMAC *)this,ipv4,udp);
  ProtocolICMP::ProtocolICMP(&this->ICMP,ipv4);
  ProtocolTCP::ProtocolTCP(&this->TCP,ipv4);
  ProtocolUDP::ProtocolUDP(udp,ipv4,&this->DHCP);
  return;
}

Assistant:

DefaultStack::DefaultStack()
    : MAC(ARP, IP)
    , IP(MAC, ARP, ICMP, TCP, UDP)
    , ARP(MAC, IP)
    , DHCP(MAC, IP, UDP)
    , ICMP(IP)
    , TCP(IP)
    , UDP(IP, DHCP)
{
}